

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall pbrt::SpotLight::PDF_Le(SpotLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float *in_RCX;
  undefined4 *in_RDX;
  long in_RDI;
  Float FVar1;
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  Vector3<float> VVar4;
  Float cosTheta;
  Float p [2];
  Vector3<float> *in_stack_000000b8;
  Transform *in_stack_000000c0;
  Float in_stack_ffffffffffffffa8;
  Float in_stack_ffffffffffffffac;
  Tuple3<pbrt::Vector3,_float> local_38;
  Float local_2c;
  float local_28;
  float local_24;
  float *local_20;
  
  *in_RDX = 0;
  local_28 = 1.0 - *(float *)(in_RDI + 0xc4);
  local_24 = (*(float *)(in_RDI + 0xc4) - *(float *)(in_RDI + 200)) * 0.5;
  auVar3 = (undefined1  [56])0x0;
  local_20 = in_RCX;
  VVar4 = Transform::ApplyInverse<float>(in_stack_000000c0,in_stack_000000b8);
  local_38.z = VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar3;
  local_38._0_8_ = vmovlpd_avx(auVar2._0_16_);
  local_2c = CosTheta((Vector3f *)&local_38);
  if (local_2c < *(float *)(in_RDI + 0xc4)) {
    FVar1 = SmoothStepPDF((Float)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    *local_20 = (FVar1 / 6.2831855) * (local_24 / (local_28 + local_24));
  }
  else {
    FVar1 = UniformConePDF(*(Float *)(in_RDI + 0xc4));
    *local_20 = (FVar1 * local_28) / (local_28 + local_24);
  }
  return;
}

Assistant:

void SpotLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;

    // Unnormalized probabilities of sampling each part.
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};

    Float cosTheta = CosTheta(renderFromLight.ApplyInverse(ray.d));
    if (cosTheta >= cosFalloffStart)
        *pdfDir = UniformConePDF(cosFalloffStart) * p[0] / (p[0] + p[1]);
    else
        *pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) / (2 * Pi) *
                  (p[1] / (p[0] + p[1]));
}